

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

int __thiscall
kj::ArrayBuilder<kj::MainBuilder::Impl::Arg>::truncate
          (ArrayBuilder<kj::MainBuilder::Impl::Arg> *this,char *__file,__off_t __length)

{
  Arg *pAVar1;
  Arg *pAVar2;
  undefined8 in_RAX;
  undefined8 extraout_RAX;
  
  pAVar1 = this->ptr;
  while (pAVar2 = this->pos, pAVar1 + (long)__file < pAVar2) {
    this->pos = pAVar2 + -1;
    Own<kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::Iface>::dispose
              (&pAVar2[-1].callback.impl);
    in_RAX = extraout_RAX;
  }
  return (int)in_RAX;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (__has_trivial_destructor(T)) {
      pos = target;
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }